

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

nghttp2_nv * hd_get_table_entry(nghttp2_hd_context *context,size_t idx)

{
  size_t idx_local;
  nghttp2_hd_context *context_local;
  
  if (idx == 0) {
    context_local = (nghttp2_hd_context *)0x0;
  }
  else if (idx - 1 < (context->hd_table).len + 0x3d) {
    context_local = (nghttp2_hd_context *)nghttp2_hd_table_get2(context,idx - 1);
  }
  else {
    context_local = (nghttp2_hd_context *)0x0;
  }
  return (nghttp2_nv *)context_local;
}

Assistant:

static const nghttp2_nv *hd_get_table_entry(nghttp2_hd_context *context,
                                            size_t idx) {
  if (idx == 0) {
    return NULL;
  }

  --idx;

  if (!INDEX_RANGE_VALID(context, idx)) {
    return NULL;
  }

  return nghttp2_hd_table_get2(context, idx);
}